

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::Section::~Section(Section *this)

{
  int iVar1;
  IContext *pIVar2;
  undefined4 extraout_var;
  Section *this_local;
  
  if ((this->m_sectionIncluded & 1U) != 0) {
    pIVar2 = getCurrentContext();
    iVar1 = (*pIVar2->_vptr_IContext[2])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))
              ((long *)CONCAT44(extraout_var,iVar1),this,&this->m_assertions);
  }
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Section() {
            if( m_sectionIncluded )
                getCurrentContext().getResultCapture().sectionEnded( m_name, m_assertions );
        }